

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEnvelope.cpp
# Opt level: O2

void __thiscall dsa::CEnvelope::Reset(CEnvelope *this,UINT32 clock,UINT32 rate)

{
  uint uVar1;
  UINT32 *pUVar2;
  ulong uVar3;
  
  this->m_rate = rate;
  this->m_clock = clock;
  this->m_cnt = 0;
  this->m_inc = (int)(0x10000000 / (ulong)clock) * rate;
  uVar1 = this->m_ch;
  pUVar2 = &this->m_ci->value;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    *pUVar2 = 0;
    ((ChannelInfo *)(pUVar2 + -2))->state = FINISH;
    ((ChannelInfo *)(pUVar2 + -2))->speed = 0;
    pUVar2 = pUVar2 + 8;
  }
  return;
}

Assistant:

void CEnvelope::Reset(UINT32 clock, UINT32 rate) {
  m_rate = rate;
  m_clock = clock;
  m_cnt = 0;
  m_inc = (MAX_CNT/m_clock) * m_rate;
  for(UINT ch=0; ch<m_ch; ch++) {
    m_ci[ch].value = 0;
    m_ci[ch].speed = 0;
    m_ci[ch].state = FINISH;
  }
}